

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall MakefileGenerator::valList(MakefileGenerator *this,ProStringList *varList)

{
  QString *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *this_00;
  QString *before;
  ProStringList *varList_00;
  MakefileGenerator *this_01;
  QString *ch;
  QString local_50;
  ProStringList local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (MakefileGenerator *)&stack0xffffffffffffffe0;
  this_00 = in_RDI;
  ch = in_RDX;
  QString::QString(in_RDI,(char *)in_RDX);
  varList_00 = &local_38;
  QString::QString(this_00,(char *)ch);
  before = &local_50;
  QString::QString(this_00,(char *)ch);
  valGlue(this_01,varList_00,before,in_RDX,in_RSI);
  QString::~QString((QString *)0x18cf60);
  QString::~QString((QString *)0x18cf6a);
  QString::~QString((QString *)0x18cf74);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::valList(const ProStringList &varList) const
{
    return valGlue(varList, "", " \\\n\t\t", "");
}